

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepScanLineInputFile::readPixelSampleCounts
          (DeepScanLineInputFile *this,int scanline1,int scanline2)

{
  long *plVar1;
  ArgExc *pAVar2;
  int *piVar3;
  bool *pbVar4;
  long in_RDI;
  stringstream _iex_replace_s;
  BaseExc *e;
  int maxYInLineBuffer;
  int minYInLineBuffer;
  int lineBlockId;
  int i;
  int scanLineMax;
  int scanLineMin;
  lock_guard<std::mutex> lock;
  uint64_t savedFilePos;
  undefined1 in_stack_000006d3;
  int in_stack_000006d4;
  Array2D<unsigned_int> *in_stack_000006d8;
  int in_stack_000006e4;
  Data *in_stack_000006e8;
  InputStreamMutex *in_stack_000006f0;
  mutex_type *in_stack_fffffffffffffd98;
  lock_guard<std::mutex> *in_stack_fffffffffffffda0;
  Data *in_stack_fffffffffffffdb8;
  int *in_stack_fffffffffffffdc0;
  long lVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  char *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  Header *in_stack_fffffffffffffe40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  undefined8 local_18;
  int local_10;
  int local_c [3];
  
  local_18 = 0;
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0x1d0) & 1) == 0) {
    pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar2,"readPixelSampleCounts called with no valid frame buffer");
    __cxa_throw(pAVar2,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  local_18 = (**(code **)(**(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1f8) + 0x28) + 0x28))();
  piVar3 = std::min<int>(local_c,&local_10);
  local_34 = *piVar3;
  piVar3 = std::max<int>(local_c,&local_10);
  local_38 = *piVar3;
  if ((local_34 < *(int *)(*(long *)(in_RDI + 8) + 0xdc)) ||
     (*(int *)(*(long *)(in_RDI + 8) + 0xe0) < local_38)) {
    pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc
              (pAVar2,"Tried to read scan line sample counts outside the image file\'s data window."
              );
    __cxa_throw(pAVar2,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  local_3c = local_34;
  do {
    if (local_38 < local_3c) {
      plVar1 = *(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x1f8) + 0x28);
      (**(code **)(*plVar1 + 0x30))(plVar1,local_18);
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x19b1f9);
      return;
    }
    if ((*(byte *)(*(long *)(in_RDI + 8) + 0x181) & 1) == 0) {
      pbVar4 = Array::operator_cast_to_bool_((Array *)(*(long *)(in_RDI + 8) + 0x1b0));
      if ((pbVar4[local_3c - *(int *)(*(long *)(in_RDI + 8) + 0xdc)] & 1U) == 0) goto LAB_0019afe9;
      anon_unknown_0::fillSampleCountFromCache
                ((int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),in_stack_fffffffffffffdb8);
    }
    else {
LAB_0019afe9:
      local_40 = (local_3c - *(int *)(*(long *)(in_RDI + 8) + 0xdc)) /
                 *(int *)(*(long *)(in_RDI + 8) + 0x168);
      bytesPerLine = *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
                      (*(long *)(in_RDI + 8) + 0x1f8);
      if ((*(byte *)(*(long *)(in_RDI + 8) + 0x181) & 1) == 0) {
        lVar5 = *(long *)(in_RDI + 8) + 0x188;
      }
      else {
        lVar5 = 0;
      }
      anon_unknown_0::readSampleCountForLineBlock
                (in_stack_000006f0,in_stack_000006e8,in_stack_000006e4,in_stack_000006d8,
                 in_stack_000006d4,(bool)in_stack_000006d3);
      local_44 = local_40 * *(int *)(*(long *)(in_RDI + 8) + 0x168) +
                 *(int *)(*(long *)(in_RDI + 8) + 0xdc);
      local_4c = local_44 + -1 + *(int *)(*(long *)(in_RDI + 8) + 0x168);
      in_stack_fffffffffffffdc0 = std::min<int>(&local_4c,(int *)(*(long *)(in_RDI + 8) + 0xe0));
      local_48 = *in_stack_fffffffffffffdc0;
      bytesPerDeepLineTable
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
                 in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,
                 in_stack_fffffffffffffe50);
      offsetInLineBufferTable
                (bytesPerLine,(int)((ulong)lVar5 >> 0x20),(int)lVar5,
                 (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffdb8)
      ;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void
DeepScanLineInputFile::readPixelSampleCounts (int scanline1, int scanline2)
{
    uint64_t savedFilePos = 0;

    if (!_data->frameBufferValid)
    {
        throw IEX_NAMESPACE::ArgExc (
            "readPixelSampleCounts called with no valid frame buffer");
    }

    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
        savedFilePos = _data->_streamData->is->tellg ();

        int scanLineMin = min (scanline1, scanline2);
        int scanLineMax = max (scanline1, scanline2);

        if (scanLineMin < _data->minY || scanLineMax > _data->maxY)
            throw IEX_NAMESPACE::ArgExc (
                "Tried to read scan line sample counts outside "
                "the image file's data window.");

        for (int i = scanLineMin; i <= scanLineMax; i++)
        {
            //
            // if scanline is already read, and file is small enough to cache, count data will be in the cache
            // otherwise, read from file, store in cache and in caller's framebuffer
            //
            if (!_data->bigFile && _data->gotSampleCount[i - _data->minY])
            {
                fillSampleCountFromCache (i, _data);
            }
            else
            {

                int lineBlockId = (i - _data->minY) / _data->linesInBuffer;

                //
                // read samplecount data into external buffer
                // also cache to internal buffer unless in bigFile mode
                //
                readSampleCountForLineBlock (
                    _data->_streamData,
                    _data,
                    lineBlockId,
                    _data->bigFile ? nullptr : &_data->sampleCount,
                    _data->minY,
                    true);

                int minYInLineBuffer =
                    lineBlockId * _data->linesInBuffer + _data->minY;
                int maxYInLineBuffer = min (
                    minYInLineBuffer + _data->linesInBuffer - 1, _data->maxY);

                //
                // For each line within the block, get the count of bytes.
                //

                bytesPerDeepLineTable (
                    _data->header,
                    minYInLineBuffer,
                    maxYInLineBuffer,
                    _data->sampleCountSliceBase,
                    _data->sampleCountXStride,
                    _data->sampleCountYStride,
                    _data->bytesPerLine);

                //
                // For each scanline within the block, get the offset.
                //

                offsetInLineBufferTable (
                    _data->bytesPerLine,
                    minYInLineBuffer - _data->minY,
                    maxYInLineBuffer - _data->minY,
                    _data->linesInBuffer,
                    _data->offsetInLineBuffer);
            }
        }

        _data->_streamData->is->seekg (savedFilePos);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error reading sample count data from image "
            "file \""
                << fileName () << "\". " << e.what ());

        _data->_streamData->is->seekg (savedFilePos);

        throw;
    }
}